

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathEvalPredicate(xmlXPathContextPtr ctxt,xmlXPathObjectPtr res)

{
  int iVar1;
  
  if (res != (xmlXPathObjectPtr)0x0 && ctxt != (xmlXPathContextPtr)0x0) {
    switch(res->type) {
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      if (res->nodesetval != (xmlNodeSetPtr)0x0) {
        return (int)(res->nodesetval->nodeNr != 0);
      }
      break;
    case XPATH_BOOLEAN:
      return res->boolval;
    case XPATH_NUMBER:
      return -(uint)((double)ctxt->proximityPosition == res->floatval) & 1;
    case XPATH_STRING:
      if (res->stringval != (xmlChar *)0x0) {
        iVar1 = xmlStrlen(res->stringval);
        return (uint)(iVar1 != 0);
      }
    }
  }
  return 0;
}

Assistant:

int
xmlXPathEvalPredicate(xmlXPathContextPtr ctxt, xmlXPathObjectPtr res) {
    if ((ctxt == NULL) || (res == NULL)) return(0);
    switch (res->type) {
        case XPATH_BOOLEAN:
	    return(res->boolval);
        case XPATH_NUMBER:
	    return(res->floatval == ctxt->proximityPosition);
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
	    if (res->nodesetval == NULL)
		return(0);
	    return(res->nodesetval->nodeNr != 0);
        case XPATH_STRING:
	    return((res->stringval != NULL) &&
	           (xmlStrlen(res->stringval) != 0));
        default:
	    break;
    }
    return(0);
}